

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::ModuleDeclarationSyntax::getChild(ModuleDeclarationSyntax *this,size_t index)

{
  Token token;
  undefined8 in_RDX;
  long in_RSI;
  TokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff98;
  TokenOrSyntax *in_stack_ffffffffffffffa0;
  nullptr_t in_stack_ffffffffffffffa8;
  Info *in_stack_ffffffffffffffb0;
  
  switch(in_RDX) {
  case 0:
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    break;
  case 1:
    not_null<slang::syntax::ModuleHeaderSyntax_*>::get
              ((not_null<slang::syntax::ModuleHeaderSyntax_*> *)(in_RSI + 0x50));
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    break;
  case 2:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)(in_RSI + 0x58),in_stack_ffffffffffffff98);
    break;
  case 3:
    token.info = in_stack_ffffffffffffffb0;
    token._0_8_ = in_stack_ffffffffffffffa8;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffffa0,token);
    break;
  case 4:
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax
              ((TokenOrSyntax *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  return in_RDI;
}

Assistant:

TokenOrSyntax ModuleDeclarationSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return header.get();
        case 2: return &members;
        case 3: return endmodule;
        case 4: return blockName;
        default: return nullptr;
    }
}